

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O2

void __thiscall chatra::Reader::registerPointer<chatra::Lock>(Reader *this,Lock *ptr)

{
  pointer pPVar1;
  
  std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
  emplace_back<>(&this->pointerList);
  pPVar1 = (this->pointerList).
           super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar1[-1].mode = Raw;
  pPVar1[-1].raw = ptr;
  return;
}

Assistant:

void registerPointer(Type* ptr) {
		chatra_assert(ptr != nullptr);
		pointerList.emplace_back();
		auto& p = pointerList.back();
		p.mode = PointerMode::Raw;
		p.raw = ptr;
	}